

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tetgen.cxx
# Opt level: O1

void __thiscall tetgenmesh::optimizemesh(tetgenmesh *this)

{
  char *pcVar1;
  uint uVar2;
  arraypool *this_00;
  tetgenbehavior *ptVar3;
  double dVar4;
  tetrahedron *pppdVar5;
  char *pcVar6;
  long lVar7;
  memorypool *pmVar8;
  long lVar9;
  long lVar10;
  uint uVar11;
  int iVar12;
  long lVar13;
  void **ppvVar14;
  long lVar15;
  bool bVar16;
  double maxdd;
  optparameters opm;
  double ncosdd [6];
  
  opm.max_min_volume = 0;
  opm.min_max_aspectratio = 0;
  opm.min_max_dihedangle = 0;
  opm.initval = 0.0;
  opm.imprval = 0.0;
  opm.numofsearchdirs = 10;
  opm.searchstep = 0.01;
  opm.maxiter = -1;
  opm.smthiter = 0;
  if (this->b->quiet == 0) {
    puts("Optimizing mesh...");
  }
  uVar2 = this->b->optlevel;
  uVar11 = ~(-1 << ((byte)uVar2 & 0x1f));
  if (this->b->verbose != 0) {
    printf("  Optimization level  = %d.\n",(ulong)uVar2);
    printf("  Optimization scheme = %d.\n",(ulong)(uint)this->b->optscheme);
    printf("  Number of iteration = %d.\n",(ulong)uVar11);
    printf("  Min_Max dihed angle = %g.\n",SUB84(this->b->optmaxdihedral,0));
  }
  dVar4 = cos((this->b->optmaxdihedral / 180.0) * PI);
  this->cosmaxdihed = dVar4;
  dVar4 = cos((this->b->optminsmtdihed / 180.0) * PI);
  this->cossmtdihed = dVar4;
  dVar4 = cos((this->b->optminslidihed / 180.0) * PI);
  this->cosslidihed = dVar4;
  iVar12 = this->numelemattrib;
  pmVar8 = this->tetrahedrons;
  ppvVar14 = pmVar8->firstblock;
  pmVar8->pathblock = ppvVar14;
  pmVar8->pathitem =
       (void *)((long)ppvVar14 +
               (((long)pmVar8->alignbytes + 8U) -
               (ulong)(ppvVar14 + 1) % (ulong)(long)pmVar8->alignbytes));
  pmVar8->pathitemsleft = pmVar8->itemsperblock;
  pppdVar5 = tetrahedrontraverse(this);
  if (pppdVar5 != (tetrahedron *)0x0) {
    do {
      if ((((this->b->convex == 0) ||
           ((double)pppdVar5[(long)this->elemattribindex + (long)iVar12 + -1] != -1.0)) ||
          (NAN((double)pppdVar5[(long)this->elemattribindex + (long)iVar12 + -1]))) &&
         (tetalldihedral(this,(point)pppdVar5[4],(point)pppdVar5[5],(point)pppdVar5[6],
                         (point)pppdVar5[7],ncosdd,&maxdd,(double *)0x0), maxdd < this->cosmaxdihed)
         ) {
        this_00 = this->unflipqueue;
        pcVar6 = arraypool::getblock(this_00,(int)this_00->objects);
        lVar13 = (long)this_00->objectbytes *
                 ((long)this_00->objectsperblock - 1U & this_00->objects);
        this_00->objects = this_00->objects + 1;
        *(tetrahedron **)(pcVar6 + lVar13) = pppdVar5;
        pcVar1 = pcVar6 + lVar13 + 8;
        pcVar1[0] = '\v';
        pcVar1[1] = '\0';
        pcVar1[2] = '\0';
        pcVar1[3] = '\0';
        *(tetrahedron *)(pcVar6 + lVar13 + 0x58) = pppdVar5[4];
        *(tetrahedron *)(pcVar6 + lVar13 + 0x60) = pppdVar5[5];
        *(tetrahedron *)(pcVar6 + lVar13 + 0x68) = pppdVar5[6];
        *(tetrahedron *)(pcVar6 + lVar13 + 0x70) = pppdVar5[7];
        *(double *)(pcVar6 + lVar13 + 0x20) = maxdd;
        lVar7 = 0;
        do {
          *(double *)(pcVar6 + lVar7 * 8 + lVar13 + 0x28) = ncosdd[lVar7];
          lVar7 = lVar7 + 1;
        } while (lVar7 != 6);
      }
      pppdVar5 = tetrahedrontraverse(this);
    } while (pppdVar5 != (tetrahedron *)0x0);
  }
  lVar7 = improvequalitybyflips(this);
  if ((this->unflipqueue->objects < 1) || (ptVar3 = this->b, (ptVar3->optscheme & 6) == 0)) {
    lVar15 = 0;
    lVar13 = 0;
  }
  else {
    pmVar8 = (memorypool *)operator_new(0x58);
    memorypool::poolinit(pmVar8,0x10,ptVar3->tetrahedraperblock,8,0);
    this->badtetrahedrons = pmVar8;
    opm.min_max_dihedangle = 1;
    opm.numofsearchdirs = 10;
    opm.maxiter = 0x1e;
    if (uVar2 == 0) {
      lVar15 = 0;
      lVar13 = 0;
    }
    else {
      iVar12 = (uVar11 - 1) + (uint)(uVar11 == 0);
      lVar13 = 0;
      lVar15 = 0;
      do {
        if ((this->b->optscheme & 2) == 0) {
LAB_0014fba4:
          lVar9 = 0;
        }
        else {
          lVar9 = improvequalitybysmoothing(this,&opm);
          lVar13 = lVar13 + lVar9;
          if (lVar9 < 1) goto LAB_0014fba4;
          lVar9 = improvequalitybyflips(this);
          lVar7 = lVar7 + lVar9;
        }
        if ((0 < this->unflipqueue->objects) && ((this->b->optscheme & 4) != 0)) {
          lVar10 = removeslivers(this,4);
          lVar15 = lVar15 + lVar10;
          if (0 < lVar10) {
            lVar9 = improvequalitybyflips(this);
            lVar7 = lVar7 + lVar9;
          }
        }
        bVar16 = iVar12 != 0;
        iVar12 = iVar12 + -1;
      } while (((0 < lVar9) && (0 < this->unflipqueue->objects)) && (bVar16));
    }
    pmVar8 = this->badtetrahedrons;
    if (pmVar8 != (memorypool *)0x0) {
      ppvVar14 = pmVar8->firstblock;
      while (ppvVar14 != (void **)0x0) {
        pmVar8->nowblock = (void **)*ppvVar14;
        free(ppvVar14);
        ppvVar14 = pmVar8->nowblock;
        pmVar8->firstblock = ppvVar14;
      }
      operator_delete(pmVar8,0x58);
    }
    this->badtetrahedrons = (memorypool *)0x0;
  }
  if (0 < this->unflipqueue->objects) {
    if (1 < this->b->verbose) {
      printf("    %ld bad tets remained.\n");
    }
    this->unflipqueue->objects = 0;
  }
  if (this->b->verbose != 0) {
    if (0 < lVar7) {
      printf("  Removed %ld edges.\n",lVar7);
    }
    if (0 < lVar13) {
      printf("  Smoothed %ld points.\n",lVar13);
    }
    if (0 < lVar15) {
      printf("  Split %ld slivers.\n",lVar15);
    }
  }
  return;
}

Assistant:

void tetgenmesh::optimizemesh()
{
  badface *parybface;
  triface checktet;
  point *ppt;
  int optpasses;
  optparameters opm;
  REAL ncosdd[6], maxdd;
  long totalremcount, remcount;
  long totalsmtcount, smtcount;
  long totalsptcount, sptcount;
  int chkencflag;
  int iter;
  int n;

  if (!b->quiet) {
    printf("Optimizing mesh...\n");
  }

  optpasses = ((1 << b->optlevel) - 1);

  if (b->verbose) {
    printf("  Optimization level  = %d.\n", b->optlevel);
    printf("  Optimization scheme = %d.\n", b->optscheme);
    printf("  Number of iteration = %d.\n", optpasses);
    printf("  Min_Max dihed angle = %g.\n", b->optmaxdihedral);
  }

  totalsmtcount = totalsptcount = totalremcount = 0l;

  cosmaxdihed = cos(b->optmaxdihedral / 180.0 * PI);
  cossmtdihed = cos(b->optminsmtdihed / 180.0 * PI);
  cosslidihed = cos(b->optminslidihed / 180.0 * PI);

  int attrnum = numelemattrib - 1; 

  // Put all bad tetrahedra into array.
  tetrahedrons->traversalinit();
  checktet.tet = tetrahedrontraverse();
  while (checktet.tet != NULL) {
    if (b->convex) { // -c
      // Skip this tet if it lies in the exterior.
      if (elemattribute(checktet.tet, attrnum) == -1.0) {
        checktet.tet = tetrahedrontraverse();
        continue;
      }
    }
    ppt = (point *) & (checktet.tet[4]);
    tetalldihedral(ppt[0], ppt[1], ppt[2], ppt[3], ncosdd, &maxdd, NULL);
    if (maxdd < cosmaxdihed) {
      // There are bad dihedral angles in this tet.
      unflipqueue->newindex((void **) &parybface); 
      parybface->tt.tet = checktet.tet;
      parybface->tt.ver = 11;
      parybface->forg = ppt[0];
      parybface->fdest = ppt[1];
      parybface->fapex = ppt[2];
      parybface->foppo = ppt[3];
      parybface->key = maxdd;
      for (n = 0; n < 6; n++) {
        parybface->cent[n] = ncosdd[n];
      }
    }
    checktet.tet = tetrahedrontraverse();
  }

  totalremcount = improvequalitybyflips();

  if ((unflipqueue->objects > 0l) && 
      ((b->optscheme & 2) || (b->optscheme & 4))) {
    // The pool is only used by removeslivers().
    badtetrahedrons = new memorypool(sizeof(triface), b->tetrahedraperblock,
                                     sizeof(void *), 0);

    // Smoothing options.
    opm.min_max_dihedangle = 1;
    opm.numofsearchdirs = 10;
    // opm.searchstep = 0.001;  
    opm.maxiter = 30; // Limit the maximum iterations.
    //opm.checkencflag = 4; // Queue affected tets after smoothing.
    chkencflag = 4; // Queue affected tets after splitting a sliver.
    iter = 0;

    while (iter < optpasses) {
      smtcount = sptcount = remcount = 0l;
      if (b->optscheme & 2) {
        smtcount += improvequalitybysmoothing(&opm);
        totalsmtcount += smtcount;
        if (smtcount > 0l) {
          remcount = improvequalitybyflips();
          totalremcount += remcount;
        }
      }
      if (unflipqueue->objects > 0l) {
        if (b->optscheme & 4) {
          sptcount += removeslivers(chkencflag);
          totalsptcount += sptcount;
          if (sptcount > 0l) {
            remcount = improvequalitybyflips();
            totalremcount += remcount;
          }
        }
      }
      if (unflipqueue->objects > 0l) {
        if (remcount > 0l) {
          iter++;
        } else {
          break;
        }
      } else {
        break;
      }
    } // while (iter)

    delete badtetrahedrons;
    badtetrahedrons = NULL;
  }

  if (unflipqueue->objects > 0l) {
    if (b->verbose > 1) {
      printf("    %ld bad tets remained.\n", unflipqueue->objects);
    }
    unflipqueue->restart();
  }

  if (b->verbose) {
    if (totalremcount > 0l) {
      printf("  Removed %ld edges.\n", totalremcount);
    }
    if (totalsmtcount > 0l) {
      printf("  Smoothed %ld points.\n", totalsmtcount);
    }
    if (totalsptcount > 0l) {
      printf("  Split %ld slivers.\n", totalsptcount);
    }
  }
}